

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3VdbeTransferError(Vdbe *p)

{
  u8 uVar1;
  int err_code;
  sqlite3 *db;
  
  db = p->db;
  err_code = p->rc;
  if (p->zErrMsg == (char *)0x0) {
    sqlite3Error(db,err_code,(char *)0x0);
  }
  else {
    uVar1 = db->mallocFailed;
    if (sqlite3Hooks_0 != (code *)0x0) {
      (*sqlite3Hooks_0)();
    }
    if (db->pErr != (Mem *)0x0) {
      sqlite3VdbeMemSetStr(db->pErr,p->zErrMsg,-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    }
    if (sqlite3Hooks_1 != (code *)0x0) {
      (*sqlite3Hooks_1)();
    }
    db->mallocFailed = uVar1;
    db->errCode = err_code;
  }
  return err_code;
}

Assistant:

SQLITE_PRIVATE int sqlite3VdbeTransferError(Vdbe *p){
  sqlite3 *db = p->db;
  int rc = p->rc;
  if( p->zErrMsg ){
    u8 mallocFailed = db->mallocFailed;
    sqlite3BeginBenignMalloc();
    sqlite3ValueSetStr(db->pErr, -1, p->zErrMsg, SQLITE_UTF8, SQLITE_TRANSIENT);
    sqlite3EndBenignMalloc();
    db->mallocFailed = mallocFailed;
    db->errCode = rc;
  }else{
    sqlite3Error(db, rc, 0);
  }
  return rc;
}